

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O0

TPM_RC TSS_CreatePrimary(TSS_DEVICE *tpm,TSS_SESSION *sess,TPM_HANDLE hierarchy,TPM2B_PUBLIC *inPub,
                        TPM_HANDLE *outHandle,TPM2B_PUBLIC *outPub)

{
  TPM_RC TVar1;
  undefined1 local_16c [8];
  TPML_PCR_SELECTION creationPCR;
  TPM2B_DATA outsideInfo;
  TPM2B_SENSITIVE_CREATE sensCreate;
  TPM2B_PUBLIC *outPub_local;
  TPM_HANDLE *outHandle_local;
  TPM2B_PUBLIC *inPub_local;
  TPM_HANDLE hierarchy_local;
  TSS_SESSION *sess_local;
  TSS_DEVICE *tpm_local;
  
  sensCreate.sensitive.data._126_8_ = outPub;
  memset(outsideInfo.t.buffer + 0x3a,0,0xca);
  memset(creationPCR.pcrSelections + 3,0,0x44);
  memset(local_16c,0,0x1c);
  TVar1 = TPM2_CreatePrimary(tpm,sess,hierarchy,
                             (TPM2B_SENSITIVE_CREATE *)(outsideInfo.t.buffer + 0x3a),inPub,
                             (TPM2B_DATA *)(creationPCR.pcrSelections + 3),
                             (TPML_PCR_SELECTION *)local_16c,outHandle,
                             (TPM2B_PUBLIC *)sensCreate.sensitive.data._126_8_,
                             (TPM2B_CREATION_DATA *)0x0,(TPM2B_DIGEST *)0x0,(TPMT_TK_CREATION *)0x0)
  ;
  return TVar1;
}

Assistant:

TPM_RC TSS_CreatePrimary(TSS_DEVICE *tpm, TSS_SESSION *sess,
    TPM_HANDLE hierarchy, TPM2B_PUBLIC *inPub,
    TPM_HANDLE *outHandle, TPM2B_PUBLIC *outPub)
{
    TPM2B_SENSITIVE_CREATE  sensCreate = { 0 };
    TPM2B_DATA              outsideInfo = { {0} };
    TPML_PCR_SELECTION      creationPCR = { 0 };

    return TPM2_CreatePrimary(tpm, sess, hierarchy, &sensCreate,
        inPub, &outsideInfo, &creationPCR,
        outHandle, outPub, NULL, NULL, NULL);
}